

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dr_wav.h
# Opt level: O1

drwav_bool32 drwav__seek_forward(drwav_seek_proc onSeek,drwav_uint64 offset,void *pUserData)

{
  drwav_bool32 dVar1;
  
  if (offset != 0) {
    do {
      if (offset >> 0x1f == 0) {
        dVar1 = (*onSeek)(pUserData,(int)offset,drwav_seek_origin_current);
        offset = 0;
        if (dVar1 == 0) {
          return 0;
        }
      }
      else {
        dVar1 = (*onSeek)(pUserData,0x7fffffff,drwav_seek_origin_current);
        if (dVar1 == 0) {
          return 0;
        }
        offset = offset - 0x7fffffff;
      }
    } while (offset != 0);
  }
  return 1;
}

Assistant:

static drwav_bool32 drwav__seek_forward(drwav_seek_proc onSeek, drwav_uint64 offset, void* pUserData)
{
    drwav_uint64 bytesRemainingToSeek = offset;
    while (bytesRemainingToSeek > 0) {
        if (bytesRemainingToSeek > 0x7FFFFFFF) {
            if (!onSeek(pUserData, 0x7FFFFFFF, drwav_seek_origin_current)) {
                return DRWAV_FALSE;
            }
            bytesRemainingToSeek -= 0x7FFFFFFF;
        } else {
            if (!onSeek(pUserData, (int)bytesRemainingToSeek, drwav_seek_origin_current)) {
                return DRWAV_FALSE;
            }
            bytesRemainingToSeek = 0;
        }
    }

    return DRWAV_TRUE;
}